

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_buffer_info(nk_memory_status *s,nk_buffer *b)

{
  nk_buffer *b_local;
  nk_memory_status *s_local;
  
  if (b == (nk_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x1fde,"void nk_buffer_info(struct nk_memory_status *, struct nk_buffer *)");
  }
  if (s == (nk_memory_status *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x1fdf,"void nk_buffer_info(struct nk_memory_status *, struct nk_buffer *)");
  }
  if ((s != (nk_memory_status *)0x0) && (b != (nk_buffer *)0x0)) {
    s->allocated = b->allocated;
    s->size = (b->memory).size;
    s->needed = b->needed;
    s->memory = (b->memory).ptr;
    s->calls = b->calls;
  }
  return;
}

Assistant:

NK_API void
nk_buffer_info(struct nk_memory_status *s, struct nk_buffer *b)
{
    NK_ASSERT(b);
    NK_ASSERT(s);
    if (!s || !b) return;
    s->allocated = b->allocated;
    s->size =  b->memory.size;
    s->needed = b->needed;
    s->memory = b->memory.ptr;
    s->calls = b->calls;
}